

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

int exefuse(voccxdef *ctx,int do_run)

{
  ushort uVar1;
  int in_ESI;
  undefined8 *in_RDI;
  errdef fr__1;
  objnum thisa;
  errdef fr_;
  objnum thisf;
  int err;
  runsdef val;
  int found;
  int i;
  vocddef *daemon;
  runcxdef *rcx;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  uint in_stack_fffffffffffffd38;
  dattyp in_stack_fffffffffffffd3c;
  voccxdef *in_stack_fffffffffffffd40;
  undefined8 local_2b8;
  int local_2b0;
  int in_stack_fffffffffffffe68;
  objnum in_stack_fffffffffffffe6e;
  runcxdef *in_stack_fffffffffffffe70;
  undefined8 local_178;
  int local_170;
  prpnum in_stack_fffffffffffffee0;
  objnum in_stack_fffffffffffffee2;
  prpnum in_stack_fffffffffffffee4;
  objnum in_stack_fffffffffffffee6;
  uchar **in_stack_fffffffffffffee8;
  runcxdef *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  objnum in_stack_ffffffffffffff10;
  int local_28;
  int local_24;
  ushort *local_20;
  
  local_28 = 0;
  local_24 = *(int *)(in_RDI + 0x1e2);
  local_20 = (ushort *)in_RDI[0x1e1];
  do {
    if (local_24 == 0) {
      local_24 = *(int *)(in_RDI + 0x1e4);
      local_20 = (ushort *)in_RDI[0x1e3];
      do {
        if (local_24 == 0) {
          return local_28;
        }
        if ((*local_20 != 0xffff) && (*(int *)(local_20 + 0xe) == 0)) {
          uVar1 = *local_20;
          local_28 = 1;
          local_2b0 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffdb8);
          if (local_2b0 == 0) {
            local_2b8 = *(undefined8 *)*in_RDI;
            *(undefined8 **)*in_RDI = &local_2b8;
            vocdusav(in_stack_fffffffffffffd40,
                     (vocddef *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            *local_20 = 0xffff;
            if (in_ESI != 0) {
              in_stack_fffffffffffffd28 = 0;
              in_stack_fffffffffffffd30 = 0;
              in_stack_fffffffffffffd38 = (uint)uVar1;
              runpprop(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee6
                       ,in_stack_fffffffffffffee4,in_stack_fffffffffffffee2,
                       in_stack_fffffffffffffee0,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08
                       ,in_stack_ffffffffffffff10);
            }
            *(undefined8 *)*in_RDI = local_2b8;
          }
          else {
            *(undefined8 *)*in_RDI = local_2b8;
            if ((local_2b0 != 0x3f5) && (local_2b0 != 0x3fb)) {
              errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                      (errdef *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            }
          }
        }
        local_20 = local_20 + 0x10;
        local_24 = local_24 + -1;
      } while( true );
    }
    if ((*local_20 != -1) && (*(int *)(local_20 + 0xe) == 0)) {
      local_28 = 1;
      local_170 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffef8);
      if (local_170 == 0) {
        local_178 = *(undefined8 *)*in_RDI;
        *(undefined8 **)*in_RDI = &local_178;
        vocdusav(in_stack_fffffffffffffd40,
                 (vocddef *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        *local_20 = -1;
        if (in_ESI != 0) {
          runpush((runcxdef *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                  (runsdef *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          runfn(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68);
        }
        *(undefined8 *)*in_RDI = local_178;
      }
      else {
        *(undefined8 *)*in_RDI = local_178;
        if ((local_170 != 0x3f5) && (local_170 != 0x3fb)) {
          errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  (errdef *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        }
      }
    }
    local_20 = local_20 + 0x10;
    local_24 = local_24 + -1;
  } while( true );
}

Assistant:

int exefuse(voccxdef *ctx, int do_run)
{
    runcxdef *rcx = ctx->voccxrun;
    vocddef  *daemon;
    int       i;
    int       found = FALSE;
    runsdef   val;
    int       err;

    /* first, execute any expired function-based fuses */
    for (i = ctx->voccxfuc, daemon = ctx->voccxfus ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV && daemon->vocdtim == 0)
        {
            objnum thisf = daemon->vocdfn;
         
            found = TRUE;
            ERRBEGIN(ctx->voccxerr)

            /* save an undo record for this slot before changing */
            vocdusav(ctx, daemon);

            /* remove the fuse prior to running  */
            daemon->vocdfn = MCMONINV;

            if (do_run)
            {
                OSCPYSTRUCT(val, daemon->vocdarg);
                runpush(rcx, val.runstyp, &val);
                runfn(rcx, thisf, 1);
            }
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }

    /* next, execute any expired method-based notifier fuses */
    for (i = ctx->voccxalc, daemon = ctx->voccxalm ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV && daemon->vocdtim == 0)
        {
            objnum thisa = daemon->vocdfn;

            found = TRUE;
            ERRBEGIN(ctx->voccxerr)

            /* save an undo record for this slot before changing */
            vocdusav(ctx, daemon);

            /* delete it prior to running it */
            daemon->vocdfn = MCMONINV;

            if (do_run)
                runppr(rcx, thisa, daemon->vocdprp, 0);
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }

    /* return true if we found any expired fuses */
    return found;
}